

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabConv.cpp
# Opt level: O0

void amrex::RealDescriptor::convertToNativeFloatFormat
               (float *out,Long nitems,istream *is,RealDescriptor *id)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  long *plVar4;
  Long *nitems_00;
  ulong uVar5;
  char *in_RDX;
  long in_RSI;
  int *in_RDI;
  RealDescriptor *in_stack_00000038;
  RealDescriptor *in_stack_00000040;
  int in_stack_0000004c;
  Long in_stack_00000050;
  void *in_stack_00000058;
  void *in_stack_00000060;
  Long get;
  char *bufr;
  Long buffSize;
  char *in_stack_ffffffffffffff50;
  int *outord;
  Long *outfor;
  char *out_00;
  long local_50;
  Long *local_48;
  void *local_40;
  long local_38;
  long local_30;
  char *local_20;
  long local_18;
  int *local_10;
  char *local_8;
  
  local_38 = (long)readBufferSize;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  plVar4 = std::min<long>(&local_38,&local_18);
  lVar1 = *plVar4;
  local_30 = lVar1;
  iVar3 = numBytes((RealDescriptor *)0x1242f00);
  local_40 = operator_new__(lVar1 * iVar3);
  for (; 0 < local_18; local_18 = local_18 - (long)local_48) {
    local_50 = (long)readBufferSize;
    plVar4 = std::min<long>(&local_50,&local_18);
    pvVar2 = local_40;
    local_48 = (Long *)*plVar4;
    out_00 = local_20;
    numBytes((RealDescriptor *)0x1242f77);
    std::istream::read(out_00,(long)pvVar2);
    FPC::Native32RealDescriptor();
    FPC::NativeLongDescriptor();
    PD_convert(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_0000004c,
               in_stack_00000040,in_stack_00000038,(IntDescriptor *)get,(int)bufr);
    if ((bAlwaysFixDenormals & 1) != 0) {
      outord = local_10;
      outfor = local_48;
      FPC::Native32RealDescriptor();
      nitems_00 = format((RealDescriptor *)0x1243031);
      FPC::Native32RealDescriptor();
      order((RealDescriptor *)0x1243043);
      PD_fixdenormals(out_00,(Long)nitems_00,outfor,outord);
    }
    local_10 = local_10 + (long)local_48;
  }
  uVar5 = std::ios::fail();
  if ((uVar5 & 1) != 0) {
    local_8 = "convert(Real*,Long,istream&,RealDescriptor&) failed";
    Error_host(in_stack_ffffffffffffff50);
  }
  if (local_40 != (void *)0x0) {
    operator_delete__(local_40);
  }
  return;
}

Assistant:

void
RealDescriptor::convertToNativeFloatFormat (float*                out,
                                            Long                  nitems,
                                            std::istream&         is,
                                            const RealDescriptor& id)
{
//    BL_PROFILE("RD:convertToNativeFloatFormat");

    Long buffSize(std::min(Long(readBufferSize), nitems));
    char *bufr = new char[buffSize * id.numBytes()];

    while (nitems > 0)
    {
        Long get = std::min(static_cast<Long>(readBufferSize), nitems);
        is.read(bufr, id.numBytes()*get);
        PD_convert(out,
                   bufr,
                   get,
                   0,
                   FPC::Native32RealDescriptor(),
                   id,
                   FPC::NativeLongDescriptor());

        if(bAlwaysFixDenormals) {
          PD_fixdenormals(out, get, FPC::Native32RealDescriptor().format(),
                          FPC::Native32RealDescriptor().order());
        }
        nitems -= get;
        out    += get;
    }

    if(is.fail()) {
      amrex::Error("convert(Real*,Long,istream&,RealDescriptor&) failed");
    }

    delete [] bufr;
}